

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImTriangulator::BuildNodes(ImTriangulator *this,ImVec2 *points,int points_count)

{
  int i;
  int points_count_local;
  ImVec2 *points_local;
  ImTriangulator *this_local;
  
  for (i = 0; i < points_count; i = i + 1) {
    this->_Nodes[i].Type = ImTriangulatorNodeType_Convex;
    this->_Nodes[i].Index = i;
    this->_Nodes[i].Pos = points[i];
    this->_Nodes[i].Next = this->_Nodes + (long)i + 1;
    this->_Nodes[i].Prev = this->_Nodes + (long)i + -1;
  }
  this->_Nodes->Prev = this->_Nodes + (long)points_count + -1;
  this->_Nodes[points_count + -1].Next = this->_Nodes;
  return;
}

Assistant:

void ImTriangulator::BuildNodes(const ImVec2* points, int points_count)
{
    for (int i = 0; i < points_count; i++)
    {
        _Nodes[i].Type = ImTriangulatorNodeType_Convex;
        _Nodes[i].Index = i;
        _Nodes[i].Pos = points[i];
        _Nodes[i].Next = _Nodes + i + 1;
        _Nodes[i].Prev = _Nodes + i - 1;
    }
    _Nodes[0].Prev = _Nodes + points_count - 1;
    _Nodes[points_count - 1].Next = _Nodes;
}